

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::ParseHelper_FixTruncatedFloatString
          (X3DImporter *this,char *pInStr,string *pOutString)

{
  size_t sVar1;
  char cVar2;
  ulong local_30;
  size_t ci;
  size_t instr_len;
  string *pOutString_local;
  char *pInStr_local;
  X3DImporter *this_local;
  
  std::__cxx11::string::clear();
  sVar1 = strlen(pInStr);
  if (sVar1 != 0) {
    std::__cxx11::string::reserve((ulong)pOutString);
    cVar2 = (char)pOutString;
    if (*pInStr == '.') {
      std::__cxx11::string::push_back(cVar2);
    }
    std::__cxx11::string::push_back(cVar2);
    for (local_30 = 1; local_30 < sVar1; local_30 = local_30 + 1) {
      if ((pInStr[local_30] == '.') &&
         ((((pInStr[local_30 - 1] == ' ' || (pInStr[local_30 - 1] == '-')) ||
           (pInStr[local_30 - 1] == '+')) || (pInStr[local_30 - 1] == '\t')))) {
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
      }
      else {
        std::__cxx11::string::push_back(cVar2);
      }
    }
  }
  return;
}

Assistant:

void X3DImporter::ParseHelper_FixTruncatedFloatString(const char* pInStr, std::string& pOutString)
{
	pOutString.clear();
    const size_t instr_len = strlen(pInStr);
    if ( 0 == instr_len )
    {
        return;
    }

	pOutString.reserve(instr_len * 3 / 2);
	// check and correct floats in format ".x". Must be "x.y".
    if ( pInStr[ 0 ] == '.' )
    {
        pOutString.push_back( '0' );
    }

	pOutString.push_back(pInStr[0]);
	for(size_t ci = 1; ci < instr_len; ci++)
	{
		if((pInStr[ci] == '.') && ((pInStr[ci - 1] == ' ') || (pInStr[ci - 1] == '-') || (pInStr[ci - 1] == '+') || (pInStr[ci - 1] == '\t')))
		{
			pOutString.push_back('0');
			pOutString.push_back('.');
		}
		else
		{
			pOutString.push_back(pInStr[ci]);
		}
	}
}